

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O2

int unres_data_add(unres_data *unres,lyd_node *node,UNRES_ITEM type)

{
  lyd_node **pplVar1;
  UNRES_ITEM *pUVar2;
  LY_ERR *pLVar3;
  uint uVar4;
  
  if ((unres != (unres_data *)0x0) && (node != (lyd_node *)0x0)) {
    if (5 < type - UNRES_LEAFREF) {
      __assert_fail("(type == UNRES_LEAFREF) || (type == UNRES_INSTID) || (type == UNRES_WHEN) || (type == UNRES_MUST) || (type == UNRES_MUST_INOUT) || (type == UNRES_UNION)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                    ,0x1e37,
                    "int unres_data_add(struct unres_data *, struct lyd_node *, enum UNRES_ITEM)");
    }
    uVar4 = unres->count + 1;
    unres->count = uVar4;
    pplVar1 = (lyd_node **)ly_realloc(unres->node,(ulong)uVar4 << 3);
    unres->node = pplVar1;
    if (pplVar1 != (lyd_node **)0x0) {
      uVar4 = unres->count;
      pplVar1[uVar4 - 1] = node;
      pUVar2 = (UNRES_ITEM *)ly_realloc(unres->type,(ulong)uVar4 << 2);
      unres->type = pUVar2;
      if (pUVar2 != (UNRES_ITEM *)0x0) {
        pUVar2[unres->count - 1] = type;
        if (type != UNRES_WHEN) {
          return 0;
        }
        node->field_0x9 = node->field_0x9 & 0xf1 | 8;
        return 0;
      }
    }
    pLVar3 = ly_errno_location();
    *pLVar3 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","unres_data_add");
    return -1;
  }
  __assert_fail("unres && node",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                ,0x1e35,
                "int unres_data_add(struct unres_data *, struct lyd_node *, enum UNRES_ITEM)");
}

Assistant:

int
unres_data_add(struct unres_data *unres, struct lyd_node *node, enum UNRES_ITEM type)
{
    assert(unres && node);
    assert((type == UNRES_LEAFREF) || (type == UNRES_INSTID) || (type == UNRES_WHEN) || (type == UNRES_MUST)
           || (type == UNRES_MUST_INOUT) || (type == UNRES_UNION));

    unres->count++;
    unres->node = ly_realloc(unres->node, unres->count * sizeof *unres->node);
    if (!unres->node) {
        LOGMEM;
        return -1;
    }
    unres->node[unres->count - 1] = node;
    unres->type = ly_realloc(unres->type, unres->count * sizeof *unres->type);
    if (!unres->type) {
        LOGMEM;
        return -1;
    }
    unres->type[unres->count - 1] = type;

    if (type == UNRES_WHEN) {
        /* remove previous result */
        node->when_status = LYD_WHEN;
    }

    return EXIT_SUCCESS;
}